

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwhash.h
# Opt level: O2

int hydro_pwhash_reencrypt(uint8_t *stored,uint8_t *master_key,uint8_t *new_master_key)

{
  uint8_t *c;
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if (*stored == '\x01') {
    c = stored + 1;
    iVar1 = hydro_secretbox_decrypt(c,c,0x66,1,"hydro_pw",master_key);
    if (iVar1 == 0) {
      *(undefined2 *)(stored + 0x65) = *(undefined2 *)(stored + 0x41);
      *(undefined8 *)(stored + 0x25) = *(undefined8 *)c;
      *(undefined8 *)(stored + 0x2d) = *(undefined8 *)(stored + 9);
      *(undefined8 *)(stored + 0x35) = *(undefined8 *)(stored + 0x11);
      *(undefined8 *)(stored + 0x3d) = *(undefined8 *)(stored + 0x19);
      *(undefined8 *)(stored + 0x45) = *(undefined8 *)(stored + 0x21);
      *(undefined8 *)(stored + 0x4d) = *(undefined8 *)(stored + 0x29);
      *(undefined8 *)(stored + 0x55) = *(undefined8 *)(stored + 0x31);
      *(undefined8 *)(stored + 0x5d) = *(undefined8 *)(stored + 0x39);
      hydro_secretbox_encrypt(c,stored + 0x25,0x42,(ulong)*stored,"hydro_pw",new_master_key);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
hydro_pwhash_reencrypt(uint8_t       stored[hydro_pwhash_STOREDBYTES],
                       const uint8_t master_key[hydro_pwhash_MASTERKEYBYTES],
                       const uint8_t new_master_key[hydro_pwhash_MASTERKEYBYTES])
{
    uint8_t *const enc_alg   = &stored[0];
    uint8_t *const secretbox = &enc_alg[hydro_pwhash_ENC_ALGBYTES];
    uint8_t *const params    = &secretbox[hydro_secretbox_HEADERBYTES];

    if (*enc_alg != hydro_pwhash_ENC_ALG) {
        return -1;
    }
    if (hydro_secretbox_decrypt(secretbox, secretbox,
                                hydro_secretbox_HEADERBYTES + hydro_pwhash_PARAMSBYTES,
                                (uint64_t) *enc_alg, hydro_pwhash_CONTEXT, master_key) != 0) {
        return -1;
    }
    memmove(params, secretbox, hydro_pwhash_PARAMSBYTES);
    return hydro_secretbox_encrypt(secretbox, params, hydro_pwhash_PARAMSBYTES, (uint64_t) *enc_alg,
                                   hydro_pwhash_CONTEXT, new_master_key);
}